

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_schnorrsig_sign_internal
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_nonce_function_hardened noncefp,void *ndata)

{
  uint *puVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint uVar36;
  uint uVar37;
  uint uVar38;
  char cVar39;
  uint uVar40;
  int iVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  uchar *p;
  uint uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  code *pcVar61;
  undefined1 auVar62 [16];
  secp256k1_scalar sk;
  secp256k1_scalar k;
  uchar seckey [32];
  uchar buf [32];
  uchar pk_buf [32];
  secp256k1_scalar e;
  secp256k1_ge r;
  uint64_t l [8];
  secp256k1_ge pk;
  secp256k1_gej rj;
  
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  if ((ctx->ecmult_gen_ctx).built == 0) {
    secp256k1_schnorrsig_sign_internal_cold_5();
  }
  else if (sig64 == (uchar *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_4();
  }
  else if (msglen == 0 || msg != (uchar *)0x0) {
    if (keypair != (secp256k1_keypair *)0x0) {
      pcVar61 = nonce_function_bip340;
      if (noncefp != (secp256k1_nonce_function_hardened)0x0) {
        pcVar61 = noncefp;
      }
      uVar40 = secp256k1_keypair_load(ctx,&sk,&pk,keypair);
      if (((byte)pk.y.n[0] & 1) != 0) {
        secp256k1_scalar_negate(&sk,&sk);
      }
      secp256k1_scalar_get_b32(seckey,&sk);
      secp256k1_fe_impl_get_b32(pk_buf,&pk.x);
      iVar41 = (*pcVar61)(buf,msg,msglen,seckey,pk_buf,"BIP0340/nonce",0xd,ndata);
      secp256k1_scalar_set_b32(&k,buf,(int *)0x0);
      if (iVar41 == 0) {
        uVar40 = 0;
      }
      if (((k.d[1] == 0 && k.d[0] == 0) && k.d[2] == 0) && k.d[3] == 0) {
        uVar40 = 0;
      }
      uVar49 = uVar40 ^ 1;
      uVar42 = (long)(int)uVar49 - 1;
      k.d[1] = k.d[1] & uVar42;
      k.d[0] = (ulong)(uVar49 & 1) | k.d[0] & uVar42;
      k.d[3] = uVar42 & k.d[3];
      k.d[2] = k.d[2] & uVar42;
      rj.x.n[0]._0_4_ = uVar49;
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&rj,&k);
      secp256k1_ge_set_gej(&r,&rj);
      if (ctx->declassify != 0) {
        secp256k1_schnorrsig_sign_internal_cold_1();
      }
      secp256k1_fe_impl_normalize_var(&r.y);
      if (((byte)r.y.n[0] & 1) != 0) {
        secp256k1_scalar_negate(&k,&k);
      }
      secp256k1_fe_impl_normalize_var(&r.x);
      secp256k1_fe_impl_get_b32(sig64,&r.x);
      secp256k1_schnorrsig_challenge(&e,sig64,msg,msglen,pk_buf);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = e.d[0];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = sk.d[0];
      uVar44 = SUB168(auVar62 * auVar18,8);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar44;
      l[0] = SUB168(auVar62 * auVar18,0);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = e.d[0];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = sk.d[1];
      auVar3 = auVar3 * auVar19;
      uVar50 = SUB168(auVar3 + auVar35,0);
      uVar55 = SUB168(auVar3 + auVar35,8);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = e.d[1];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = sk.d[0];
      uVar45 = SUB168(auVar4 * auVar20,8);
      uVar42 = SUB168(auVar4 * auVar20,0);
      l[1] = uVar50 + uVar42;
      uVar42 = (ulong)CARRY8(uVar50,uVar42);
      uVar50 = uVar55 + uVar45;
      uVar56 = uVar50 + uVar42;
      uVar57 = (ulong)CARRY8(auVar3._8_8_,(ulong)CARRY8(uVar44,auVar3._0_8_)) +
               (ulong)(CARRY8(uVar55,uVar45) || CARRY8(uVar50,uVar42));
      auVar5._8_8_ = 0;
      auVar5._0_8_ = e.d[0];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = sk.d[2];
      uVar46 = SUB168(auVar5 * auVar21,8);
      uVar42 = SUB168(auVar5 * auVar21,0);
      uVar44 = uVar56 + uVar42;
      uVar42 = (ulong)CARRY8(uVar56,uVar42);
      uVar45 = uVar57 + uVar46;
      uVar58 = uVar45 + uVar42;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = e.d[1];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = sk.d[1];
      uVar47 = SUB168(auVar6 * auVar22,8);
      uVar50 = SUB168(auVar6 * auVar22,0);
      uVar56 = uVar44 + uVar50;
      uVar50 = (ulong)CARRY8(uVar44,uVar50);
      uVar55 = uVar58 + uVar47;
      uVar59 = uVar55 + uVar50;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = e.d[2];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = sk.d[0];
      uVar48 = SUB168(auVar7 * auVar23,8);
      uVar44 = SUB168(auVar7 * auVar23,0);
      l[2] = uVar56 + uVar44;
      uVar44 = (ulong)CARRY8(uVar56,uVar44);
      uVar56 = uVar59 + uVar48;
      uVar60 = uVar56 + uVar44;
      uVar51 = (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar45,uVar42)) +
               (ulong)(CARRY8(uVar58,uVar47) || CARRY8(uVar55,uVar50)) +
               (ulong)(CARRY8(uVar59,uVar48) || CARRY8(uVar56,uVar44));
      auVar8._8_8_ = 0;
      auVar8._0_8_ = e.d[0];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = sk.d[3];
      uVar48 = SUB168(auVar8 * auVar24,8);
      uVar42 = SUB168(auVar8 * auVar24,0);
      uVar44 = uVar60 + uVar42;
      uVar42 = (ulong)CARRY8(uVar60,uVar42);
      uVar55 = uVar51 + uVar48;
      uVar60 = uVar55 + uVar42;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = e.d[1];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = sk.d[2];
      uVar57 = SUB168(auVar9 * auVar25,8);
      uVar50 = SUB168(auVar9 * auVar25,0);
      uVar45 = uVar44 + uVar50;
      uVar50 = (ulong)CARRY8(uVar44,uVar50);
      uVar56 = uVar60 + uVar57;
      uVar52 = uVar56 + uVar50;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = e.d[2];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = sk.d[1];
      uVar58 = SUB168(auVar10 * auVar26,8);
      uVar44 = SUB168(auVar10 * auVar26,0);
      uVar47 = uVar45 + uVar44;
      uVar44 = (ulong)CARRY8(uVar45,uVar44);
      uVar46 = uVar52 + uVar58;
      uVar53 = uVar46 + uVar44;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = e.d[3];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = sk.d[0];
      uVar59 = SUB168(auVar11 * auVar27,8);
      uVar45 = SUB168(auVar11 * auVar27,0);
      l[3] = uVar47 + uVar45;
      uVar45 = (ulong)CARRY8(uVar47,uVar45);
      uVar47 = uVar53 + uVar59;
      uVar54 = uVar47 + uVar45;
      uVar57 = (ulong)(CARRY8(uVar51,uVar48) || CARRY8(uVar55,uVar42)) +
               (ulong)(CARRY8(uVar60,uVar57) || CARRY8(uVar56,uVar50)) +
               (ulong)(CARRY8(uVar52,uVar58) || CARRY8(uVar46,uVar44)) +
               (ulong)(CARRY8(uVar53,uVar59) || CARRY8(uVar47,uVar45));
      auVar12._8_8_ = 0;
      auVar12._0_8_ = e.d[1];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = sk.d[3];
      uVar46 = SUB168(auVar12 * auVar28,8);
      uVar42 = SUB168(auVar12 * auVar28,0);
      uVar44 = uVar54 + uVar42;
      uVar42 = (ulong)CARRY8(uVar54,uVar42);
      uVar45 = uVar57 + uVar46;
      uVar58 = uVar45 + uVar42;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = e.d[2];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = sk.d[2];
      uVar47 = SUB168(auVar13 * auVar29,8);
      uVar50 = SUB168(auVar13 * auVar29,0);
      uVar56 = uVar44 + uVar50;
      uVar50 = (ulong)CARRY8(uVar44,uVar50);
      uVar55 = uVar58 + uVar47;
      uVar59 = uVar55 + uVar50;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = e.d[3];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = sk.d[1];
      uVar48 = SUB168(auVar14 * auVar30,8);
      uVar44 = SUB168(auVar14 * auVar30,0);
      l[4] = uVar56 + uVar44;
      uVar44 = (ulong)CARRY8(uVar56,uVar44);
      uVar56 = uVar59 + uVar48;
      uVar51 = uVar56 + uVar44;
      uVar46 = (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar45,uVar42)) +
               (ulong)(CARRY8(uVar58,uVar47) || CARRY8(uVar55,uVar50)) +
               (ulong)(CARRY8(uVar59,uVar48) || CARRY8(uVar56,uVar44));
      auVar15._8_8_ = 0;
      auVar15._0_8_ = e.d[2];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = sk.d[3];
      uVar55 = SUB168(auVar15 * auVar31,8);
      uVar42 = SUB168(auVar15 * auVar31,0);
      uVar45 = uVar51 + uVar42;
      uVar42 = (ulong)CARRY8(uVar51,uVar42);
      uVar44 = uVar46 + uVar55;
      uVar47 = uVar44 + uVar42;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = e.d[3];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = sk.d[2];
      uVar56 = SUB168(auVar16 * auVar32,8);
      uVar50 = SUB168(auVar16 * auVar32,0);
      l[5] = uVar45 + uVar50;
      uVar50 = (ulong)CARRY8(uVar45,uVar50);
      uVar45 = uVar47 + uVar56;
      auVar34._8_8_ =
           (ulong)(CARRY8(uVar46,uVar55) || CARRY8(uVar44,uVar42)) +
           (ulong)(CARRY8(uVar47,uVar56) || CARRY8(uVar45,uVar50));
      auVar34._0_8_ = uVar45 + uVar50;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = e.d[3];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = sk.d[3];
      l._48_16_ = auVar17 * auVar33 + auVar34;
      secp256k1_scalar_reduce_512(&e,l);
      secp256k1_scalar_add(&e,&e,&k);
      secp256k1_scalar_get_b32(sig64 + 0x20,&e);
      cVar39 = (char)uVar49 + -1;
      auVar62 = ZEXT216(CONCAT11(cVar39,cVar39));
      auVar62 = pshuflw(auVar62,auVar62,0);
      uVar49 = auVar62._0_4_;
      lVar43 = 0;
      do {
        puVar1 = (uint *)(sig64 + lVar43);
        uVar36 = puVar1[1];
        uVar37 = puVar1[2];
        uVar38 = puVar1[3];
        puVar2 = (uint *)(sig64 + lVar43);
        *puVar2 = *puVar1 & uVar49;
        puVar2[1] = uVar36 & uVar49;
        puVar2[2] = uVar37 & uVar49;
        puVar2[3] = uVar38 & uVar49;
        lVar43 = lVar43 + 0x10;
      } while (lVar43 != 0x40);
      return uVar40;
    }
    secp256k1_schnorrsig_sign_internal_cold_2();
  }
  else {
    secp256k1_schnorrsig_sign_internal_cold_3();
  }
  return 0;
}

Assistant:

static int secp256k1_schnorrsig_sign_internal(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_nonce_function_hardened noncefp, void *ndata) {
    secp256k1_scalar sk;
    secp256k1_scalar e;
    secp256k1_scalar k;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_ge r;
    unsigned char buf[32] = { 0 };
    unsigned char pk_buf[32];
    unsigned char seckey[32];
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(keypair != NULL);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_bip340;
    }

    ret &= secp256k1_keypair_load(ctx, &sk, &pk, keypair);
    /* Because we are signing for a x-only pubkey, the secret key is negated
     * before signing if the point corresponding to the secret key does not
     * have an even Y. */
    if (secp256k1_fe_is_odd(&pk.y)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    secp256k1_scalar_get_b32(seckey, &sk);
    secp256k1_fe_get_b32(pk_buf, &pk.x);
    ret &= !!noncefp(buf, msg, msglen, seckey, pk_buf, bip340_algo, sizeof(bip340_algo), ndata);
    secp256k1_scalar_set_b32(&k, buf, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rj, &k);
    secp256k1_ge_set_gej(&r, &rj);

    /* We declassify r to allow using it as a branch point. This is fine
     * because r is not a secret. */
    secp256k1_declassify(ctx, &r, sizeof(r));
    secp256k1_fe_normalize_var(&r.y);
    if (secp256k1_fe_is_odd(&r.y)) {
        secp256k1_scalar_negate(&k, &k);
    }
    secp256k1_fe_normalize_var(&r.x);
    secp256k1_fe_get_b32(&sig64[0], &r.x);

    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, pk_buf);
    secp256k1_scalar_mul(&e, &e, &sk);
    secp256k1_scalar_add(&e, &e, &k);
    secp256k1_scalar_get_b32(&sig64[32], &e);

    secp256k1_memczero(sig64, 64, !ret);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    memset(seckey, 0, sizeof(seckey));

    return ret;
}